

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool QtPrivate::equalStrings(QBasicUtf8StringView<false> lhs,QBasicUtf8StringView<false> rhs)

{
  int iVar1;
  size_t __n;
  
  __n = lhs.m_size;
  if (__n != rhs.m_size) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(lhs.m_data,rhs.m_data,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

bool QtPrivate::equalStrings(QBasicUtf8StringView<false> lhs, QBasicUtf8StringView<false> rhs) noexcept
{
#if QT_VERSION >= QT_VERSION_CHECK(7, 0, 0) || defined(QT_BOOTSTRAPPED) || defined(QT_STATIC)
    Q_ASSERT(lhs.size() == rhs.size());
#else
    // operator== didn't enforce size prior to Qt 6.2
    if (lhs.size() != rhs.size())
        return false;
#endif
    return (!lhs.size() || memcmp(lhs.data(), rhs.data(), lhs.size()) == 0);
}